

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,string *name)

{
  bool bVar1;
  Tables *this_00;
  Symbol SVar2;
  undefined4 uStack_64;
  undefined4 uStack_54;
  MutexLockMaybe local_38;
  MutexLockMaybe lock;
  string *name_local;
  DescriptorPool *pool_local;
  Tables *this_local;
  Symbol result;
  
  lock.mu_ = (Mutex *)name;
  internal::MutexLockMaybe::MutexLockMaybe(&local_38,pool->mutex_);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->known_bad_symbols_).
           super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         );
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->known_bad_files_).
           super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         );
  SVar2 = FindSymbol(this,(string *)lock.mu_);
  result._0_8_ = SVar2.field_1;
  this_local = (Tables *)CONCAT44(this_local._4_4_,SVar2.type);
  bVar1 = Symbol::IsNull((Symbol *)&this_local);
  if ((bVar1) && (pool->underlay_ != (DescriptorPool *)0x0)) {
    this_00 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                        (&pool->underlay_->tables_);
    SVar2 = FindByNameHelper(this_00,pool->underlay_,(string *)lock.mu_);
    result._0_8_ = SVar2.field_1;
    this_local = (Tables *)CONCAT44(uStack_54,SVar2.type);
  }
  bVar1 = Symbol::IsNull((Symbol *)&this_local);
  if ((bVar1) && (bVar1 = TryFindSymbolInFallbackDatabase(pool,(string *)lock.mu_), bVar1)) {
    SVar2 = FindSymbol(this,(string *)lock.mu_);
    result._0_8_ = SVar2.field_1;
    this_local = (Tables *)CONCAT44(uStack_64,SVar2.type);
  }
  internal::MutexLockMaybe::~MutexLockMaybe(&local_38);
  SVar2._0_8_ = (ulong)this_local & 0xffffffff;
  SVar2.field_1 = (anon_union_8_8_13f84498_for_Symbol_2)result._0_8_;
  return SVar2;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(
    const DescriptorPool* pool, const string& name) {
  MutexLockMaybe lock(pool->mutex_);
  known_bad_symbols_.clear();
  known_bad_files_.clear();
  Symbol result = FindSymbol(name);

  if (result.IsNull() && pool->underlay_ != NULL) {
    // Symbol not found; check the underlay.
    result =
      pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // Symbol still not found, so check fallback database.
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = FindSymbol(name);
    }
  }

  return result;
}